

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndarray.cc
# Opt level: O0

void tvm::runtime::NDArray::Internal::DefaultDeleter(Container *ptr)

{
  TVMContext ctx;
  DeviceAPI *pDVar1;
  Container *ptr_local;
  
  if (ptr->manager_ctx == (void *)0x0) {
    if ((ptr->dl_tensor).data != (void *)0x0) {
      ctx.device_type = (ptr->dl_tensor).ctx.device_type;
      ctx.device_id = (ptr->dl_tensor).ctx.device_id;
      pDVar1 = DeviceAPI::Get(ctx,false);
      (*pDVar1->_vptr_DeviceAPI[5])(pDVar1,(ptr->dl_tensor).ctx,(ptr->dl_tensor).data);
    }
  }
  else {
    Container::DecRef((Container *)ptr->manager_ctx);
  }
  if (ptr != (Container *)0x0) {
    Container::~Container(ptr);
    operator_delete(ptr,0x60);
  }
  return;
}

Assistant:

static void DefaultDeleter(NDArray::Container *ptr) {
    using tvm::runtime::NDArray;
    if (ptr->manager_ctx != nullptr) {
      static_cast<NDArray::Container *>(ptr->manager_ctx)->DecRef();
    } else if (ptr->dl_tensor.data != nullptr) {
      tvm::runtime::DeviceAPI::Get(ptr->dl_tensor.ctx)->FreeDataSpace(ptr->dl_tensor.ctx, ptr->dl_tensor.data);
    }
    delete ptr;
  }